

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void __thiscall
XPMP2::SoundWAV::SoundWAV
          (SoundWAV *this,SoundSystem *_pSndSys,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  SoundFile::SoundFile
            (&this->super_SoundFile,_pSndSys,_filePath,_bLoop,_coneDir,_conePitch,_coneInAngle,
             _coneOutAngle,_coneOutVol);
  (this->super_SoundFile)._vptr_SoundFile = (_func_int **)&PTR__SoundWAV_002bd7e0;
  this->pBuf = (int16_t *)0x0;
  this->bufferSize = 0;
  this->freqHz = 0;
  this->numChannels = 0;
  WavRead(this);
  return;
}

Assistant:

SoundWAV::SoundWAV (SoundSystem* _pSndSys,
                    const std::string& _filePath, bool _bLoop,
                    float _coneDir, float _conePitch,
                    float _coneInAngle, float _coneOutAngle, float _coneOutVol) :
SoundFile(_pSndSys, _filePath, _bLoop, _coneDir, _conePitch,
          _coneInAngle, _coneOutAngle, _coneOutVol)
{
    // Directly try to read the WAV file, will throw exceptions if it doesn't work
    WavRead();
}